

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_relation.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::TableFunctionRelation::GetTableRef(TableFunctionRelation *this)

{
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  Value *pVVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var5;
  undefined8 uVar6;
  unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>_> this_00;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var7;
  pointer pSVar8;
  Relation *pRVar9;
  pointer pSVar10;
  QueryNode *pQVar11;
  _Head_base<0UL,_duckdb::SubqueryExpression_*,_false> this_01;
  _Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
  _Var12;
  pointer pTVar13;
  Value *other;
  long *plVar14;
  long in_RSI;
  templated_unique_single_t function;
  templated_unique_single_t table_function;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_a0;
  Value local_98;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_58;
  long local_50;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_48;
  
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_head_impl = (TableRef *)this;
  if (*(long *)(in_RSI + 0xf0) != 0) {
    this_00._M_t.
    super___uniq_ptr_impl<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
    .super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true,_true>
          )operator_new(0x58);
    SubqueryExpression::SubqueryExpression
              ((SubqueryExpression *)
               this_00._M_t.
               super___uniq_ptr_impl<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
               .super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl);
    local_98.type_._0_8_ =
         this_00._M_t.
         super___uniq_ptr_impl<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
         .super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl;
    _Var7._M_head_impl = (SelectStatement *)operator_new(0x80);
    ((_Var7._M_head_impl)->super_SQLStatement).type = SELECT_STATEMENT;
    ((_Var7._M_head_impl)->super_SQLStatement).stmt_location = 0;
    ((_Var7._M_head_impl)->super_SQLStatement).stmt_length = 0;
    ((_Var7._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_buckets =
         &((_Var7._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_single_bucket;
    ((_Var7._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
    ((_Var7._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    ((_Var7._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
    ((_Var7._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_rehash_policy.
    _M_max_load_factor = 1.0;
    ((_Var7._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_next_resize
         = 0;
    ((_Var7._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_single_bucket =
         (__node_base_ptr)0x0;
    ((_Var7._M_head_impl)->super_SQLStatement).query._M_dataplus =
         (_Alloc_hider)&((_Var7._M_head_impl)->super_SQLStatement).query.field_2;
    ((_Var7._M_head_impl)->super_SQLStatement).query._M_string_length = 0;
    ((_Var7._M_head_impl)->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
    ((_Var7._M_head_impl)->super_SQLStatement)._vptr_SQLStatement = &PTR__SelectStatement_0249af08;
    ((_Var7._M_head_impl)->node).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> =
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)0x0;
    pSVar8 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
             ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                           *)&local_98);
    _Var1._M_head_impl =
         (pSVar8->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar8->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var1._M_head_impl != (SelectStatement *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_SQLStatement + 8))();
    }
    pRVar9 = shared_ptr<duckdb::Relation,_true>::operator->
                       ((shared_ptr<duckdb::Relation,_true> *)(in_RSI + 0xf0));
    (*pRVar9->_vptr_Relation[3])(&local_a0,pRVar9);
    pSVar8 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
             ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                           *)&local_98);
    pSVar10 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->(&pSVar8->subquery);
    _Var5._M_head_impl = local_a0._M_head_impl;
    local_a0._M_head_impl = (QueryNode *)0x0;
    _Var2._M_head_impl =
         (pSVar10->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar10->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var5._M_head_impl;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    }
    if (local_a0._M_head_impl != (QueryNode *)0x0) {
      (*(local_a0._M_head_impl)->_vptr_QueryNode[1])();
    }
    pSVar8 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
             ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                           *)&local_98);
    local_a0._M_head_impl = (QueryNode *)local_98.type_._0_8_;
    pSVar8->subquery_type = SCALAR;
    local_98.type_._0_8_ = (_Head_base<0UL,_duckdb::SubqueryExpression_*,_false>)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_48,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_a0);
    if (local_a0._M_head_impl != (QueryNode *)0x0) {
      (*(((ParsedExpression *)&(local_a0._M_head_impl)->_vptr_QueryNode)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    if ((_Head_base<0UL,_duckdb::SubqueryExpression_*,_false>)local_98.type_._0_8_ !=
        (_Head_base<0UL,_duckdb::SubqueryExpression_*,_false>)0x0) {
      (*(((ParsedExpression *)local_98.type_._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])
                ();
    }
  }
  other = *(Value **)(in_RSI + 0x88);
  pVVar3 = *(Value **)(in_RSI + 0x90);
  local_50 = in_RSI;
  if (other != pVVar3) {
    do {
      pQVar11 = (QueryNode *)operator_new(0x78);
      Value::Value(&local_98,other);
      ConstantExpression::ConstantExpression((ConstantExpression *)pQVar11,&local_98);
      Value::~Value(&local_98);
      local_a0._M_head_impl = pQVar11;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_48,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_a0);
      if (local_a0._M_head_impl != (QueryNode *)0x0) {
        (*(((ParsedExpression *)&(local_a0._M_head_impl)->_vptr_QueryNode)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
      other = other + 1;
    } while (other != pVVar3);
  }
  plVar14 = *(long **)(local_50 + 0xb0);
  if (plVar14 != (long *)0x0) {
    do {
      this_01._M_head_impl = (SubqueryExpression *)operator_new(0x50);
      local_98.type_._0_8_ = (QueryNode **)((long)&local_98 + 0x10U);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,plVar14[1],plVar14[2] + plVar14[1]);
      ColumnRefExpression::ColumnRefExpression
                ((ColumnRefExpression *)this_01._M_head_impl,(string *)&local_98);
      if ((QueryNode **)local_98.type_._0_8_ != (QueryNode **)((long)&local_98 + 0x10U)) {
        operator_delete((void *)local_98.type_._0_8_);
      }
      pQVar11 = (QueryNode *)operator_new(0x78);
      Value::Value(&local_98,(Value *)(plVar14 + 5));
      ConstantExpression::ConstantExpression((ConstantExpression *)pQVar11,&local_98);
      Value::~Value(&local_98);
      _Var12.super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::SubqueryExpression_*,_false>)operator_new(0x48);
      local_a0._M_head_impl = pQVar11;
      local_98.type_._0_8_ = this_01._M_head_impl;
      ComparisonExpression::ComparisonExpression
                ((ComparisonExpression *)
                 _Var12.super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl,
                 COMPARE_BOUNDARY_START,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_98,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_a0);
      if (local_a0._M_head_impl != (QueryNode *)0x0) {
        (*(((ParsedExpression *)&(local_a0._M_head_impl)->_vptr_QueryNode)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
      local_a0._M_head_impl = (QueryNode *)0x0;
      if ((_Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
           )local_98.type_._0_8_ != (SubqueryExpression *)0x0) {
        (**(code **)(*(long *)local_98.type_._0_8_ + 8))();
      }
      local_98.type_._0_8_ =
           _Var12.super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&local_48,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_98);
      if ((tuple<duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>)
          local_98.type_._0_8_ != (_Head_base<0UL,_duckdb::SubqueryExpression_*,_false>)0x0) {
        (*(((ParsedExpression *)local_98.type_._0_8_)->super_BaseExpression)._vptr_BaseExpression[1]
        )();
      }
      plVar14 = (long *)*plVar14;
    } while (plVar14 != (long *)0x0);
  }
  _Var12.super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::SubqueryExpression_*,_false>)operator_new(0x78);
  TableFunctionRef::TableFunctionRef
            ((TableFunctionRef *)
             _Var12.super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl);
  local_98.type_._0_8_ =
       _Var12.super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl;
  make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            ((duckdb *)&local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_50 + 0x68),
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_48);
  _Var2._M_head_impl = local_a0._M_head_impl;
  local_a0._M_head_impl = (QueryNode *)0x0;
  pTVar13 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
            ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                          *)&local_98);
  _Var4._M_head_impl =
       (pTVar13->function).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pTVar13->function).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (ParsedExpression *)_Var2._M_head_impl;
  if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
  }
  uVar6 = local_98.type_._0_8_;
  local_98.type_._0_8_ =
       (tuple<duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>)0x0;
  (local_58._M_head_impl)->_vptr_TableRef = (_func_int **)uVar6;
  if (local_a0._M_head_impl != (QueryNode *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_QueryNode[1])();
  }
  if ((SubqueryExpression *)local_98.type_._0_8_ != (SubqueryExpression *)0x0) {
    (**(code **)(*(long *)local_98.type_._0_8_ + 8))();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_48);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (__uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         local_58._M_head_impl;
}

Assistant:

unique_ptr<TableRef> TableFunctionRelation::GetTableRef() {
	vector<unique_ptr<ParsedExpression>> children;
	if (input_relation) { // input relation becomes first parameter if present, always
		auto subquery = make_uniq<SubqueryExpression>();
		subquery->subquery = make_uniq<SelectStatement>();
		subquery->subquery->node = input_relation->GetQueryNode();
		subquery->subquery_type = SubqueryType::SCALAR;
		children.push_back(std::move(subquery));
	}
	for (auto &parameter : parameters) {
		children.push_back(make_uniq<ConstantExpression>(parameter));
	}

	for (auto &parameter : named_parameters) {
		// Hackity-hack some comparisons with column refs
		// This is all but pretty, basically the named parameter is the column, the table is empty because that's what
		// the function binder likes
		auto column_ref = make_uniq<ColumnRefExpression>(parameter.first);
		auto constant_value = make_uniq<ConstantExpression>(parameter.second);
		auto comparison = make_uniq<ComparisonExpression>(ExpressionType::COMPARE_EQUAL, std::move(column_ref),
		                                                  std::move(constant_value));
		children.push_back(std::move(comparison));
	}

	auto table_function = make_uniq<TableFunctionRef>();
	auto function = make_uniq<FunctionExpression>(name, std::move(children));
	table_function->function = std::move(function);
	return std::move(table_function);
}